

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O0

void __thiscall chrono::robosimian::RS_Driver::Update(RS_Driver *this,double time)

{
  ifstream *piVar1;
  double dVar2;
  axpby __binary_op;
  byte bVar3;
  reference pvVar4;
  iterator pvVar5;
  iterator pvVar6;
  iterator pvVar7;
  ostream *poVar8;
  ulong uVar9;
  iterator __result;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  int local_dc;
  int i_1;
  axpby op_1;
  undefined8 local_c0;
  undefined1 local_b8 [40];
  double t;
  undefined1 local_60 [44];
  int local_34;
  double dStack_30;
  int i;
  double x;
  ax op;
  bool ext_actuation;
  double time_local;
  RS_Driver *this_local;
  
  op.a._7_1_ = 0;
  if (this->m_phase == POSE) {
    auVar12._0_8_ = time / this->m_time_pose;
    auVar12._8_8_ = 0;
    auVar12 = vfmadd213sd_fma(ZEXT816(0x4034000000000000),auVar12,ZEXT816(0xc024000000000000));
    dStack_30 = auVar12._0_8_;
    dVar10 = exp(dStack_30);
    dVar11 = exp(dStack_30);
    x = dVar10 / (dVar11 + 1.0);
    for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
      pvVar4 = std::array<std::array<double,_8UL>,_4UL>::operator[]
                         (&this->m_actuations_1,(long)local_34);
      pvVar5 = std::array<double,_8UL>::begin(pvVar4);
      pvVar4 = std::array<std::array<double,_8UL>,_4UL>::operator[]
                         (&this->m_actuations_1,(long)local_34);
      pvVar6 = std::array<double,_8UL>::end(pvVar4);
      pvVar4 = std::array<std::array<double,_8UL>,_4UL>::operator[]
                         (&this->m_actuations,(long)local_34);
      pvVar7 = std::array<double,_8UL>::begin(pvVar4);
      local_60._32_8_ = x;
      std::transform<double*,double*,chrono::robosimian::ax>(pvVar5,pvVar6,pvVar7,(ax)x);
    }
    if (this->m_time_pose <= time) {
      this->m_phase = HOLD;
      poVar8 = std::operator<<((ostream *)&std::cout,"time = ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,time);
      poVar8 = std::operator<<(poVar8,"  Switch to phase: ");
      GetCurrentPhase_abi_cxx11_((RS_Driver *)local_60);
      poVar8 = std::operator<<(poVar8,(string *)local_60);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_60);
      if (this->m_callback != (PhaseChangeCallback *)0x0) {
        (**(code **)(*(long *)this->m_callback + 0x10))(this->m_callback,0,this->m_phase);
      }
    }
  }
  else if (this->m_phase == HOLD) {
    memcpy(&this->m_actuations,&this->m_actuations_1,0x100);
    if (this->m_offset <= time) {
      bVar3 = std::ifstream::is_open();
      this->m_phase = bVar3 ^ CYCLE;
      poVar8 = std::operator<<((ostream *)&std::cout,"time = ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,time);
      poVar8 = std::operator<<(poVar8,"  Switch to phase: ");
      GetCurrentPhase_abi_cxx11_((RS_Driver *)&t);
      poVar8 = std::operator<<(poVar8,(string *)&t);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&t);
      if (this->m_callback != (PhaseChangeCallback *)0x0) {
        (**(code **)(*(long *)this->m_callback + 0x10))(this->m_callback,1,this->m_phase);
      }
    }
  }
  else {
    local_b8._32_8_ = time - this->m_offset;
    if (this->m_phase == START) {
      while (this->m_time_2 < (double)local_b8._32_8_) {
        this->m_time_1 = this->m_time_2;
        memcpy(&this->m_actuations_1,&this->m_actuations_2,0x100);
        uVar9 = std::ios::eof();
        if ((uVar9 & 1) != 0) {
          this->m_phase = CYCLE;
          this->m_ifs = &this->m_ifs_cycle;
          LoadDataLine(this,&this->m_time_1,&this->m_actuations_1);
          LoadDataLine(this,&this->m_time_2,&this->m_actuations_2);
          this->m_offset = time;
          poVar8 = std::operator<<((ostream *)&std::cout,"time = ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,time);
          poVar8 = std::operator<<(poVar8,"  Switch to phase: ");
          GetCurrentPhase_abi_cxx11_((RS_Driver *)local_b8);
          poVar8 = std::operator<<(poVar8,(string *)local_b8);
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)local_b8);
          if (this->m_callback == (PhaseChangeCallback *)0x0) {
            return;
          }
          (**(code **)(*(long *)this->m_callback + 0x10))(this->m_callback,2,3);
          return;
        }
        LoadDataLine(this,&this->m_time_2,&this->m_actuations_2);
      }
    }
    else if (this->m_phase == CYCLE) {
      if ((this->driven & 1U) == 0) {
        while (this->m_time_2 < (double)local_b8._32_8_) {
          this->m_time_1 = this->m_time_2;
          memcpy(&this->m_actuations_1,&this->m_actuations_2,0x100);
          uVar9 = std::ios::eof();
          if ((uVar9 & 1) != 0) {
            if ((this->m_repeat & 1U) == 0) {
              return;
            }
            std::ios::clear(this->m_ifs + *(long *)(*(long *)this->m_ifs + -0x18),0);
            piVar1 = this->m_ifs;
            std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)&op_1.a2,0);
            std::istream::seekg(piVar1,op_1.a2,local_c0);
            LoadDataLine(this,&this->m_time_1,&this->m_actuations_1);
            LoadDataLine(this,&this->m_time_2,&this->m_actuations_2);
            this->m_offset = time;
            poVar8 = std::operator<<((ostream *)&std::cout,"time = ");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,time);
            poVar8 = std::operator<<(poVar8," New cycle");
            std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
            if (this->m_callback == (PhaseChangeCallback *)0x0) {
              return;
            }
            (**(code **)(*(long *)this->m_callback + 0x10))(this->m_callback,3);
            return;
          }
          LoadDataLine(this,&this->m_time_2,&this->m_actuations_2);
        }
      }
      else {
        op.a._7_1_ = 1;
      }
    }
    if ((op.a._7_1_ & 1) == 0) {
      dVar2 = (double)local_b8._32_8_ - this->m_time_2;
      dVar10 = this->m_time_1;
      dVar11 = this->m_time_2;
      op_1.a1 = ((double)local_b8._32_8_ - this->m_time_1) / (this->m_time_2 - this->m_time_1);
      for (local_dc = 0; local_dc < 4; local_dc = local_dc + 1) {
        pvVar4 = std::array<std::array<double,_8UL>,_4UL>::operator[]
                           (&this->m_actuations_1,(long)local_dc);
        pvVar5 = std::array<double,_8UL>::begin(pvVar4);
        pvVar4 = std::array<std::array<double,_8UL>,_4UL>::operator[]
                           (&this->m_actuations_1,(long)local_dc);
        pvVar6 = std::array<double,_8UL>::end(pvVar4);
        pvVar4 = std::array<std::array<double,_8UL>,_4UL>::operator[]
                           (&this->m_actuations_2,(long)local_dc);
        pvVar7 = std::array<double,_8UL>::begin(pvVar4);
        pvVar4 = std::array<std::array<double,_8UL>,_4UL>::operator[]
                           (&this->m_actuations,(long)local_dc);
        __result = std::array<double,_8UL>::begin(pvVar4);
        __binary_op.a2 = op_1.a1;
        __binary_op.a1 = dVar2 / (dVar10 - dVar11);
        std::transform<double*,double*,double*,chrono::robosimian::axpby>
                  (pvVar5,pvVar6,pvVar7,__result,__binary_op);
      }
    }
  }
  return;
}

Assistant:

void RS_Driver::Update(double time) {
    bool ext_actuation = false;
    // In the POSE phase, use a logistic function to reach first data entry
    if (m_phase == POSE) {
        ax op;
        double x = 20 * (time / m_time_pose) - 10;
        op.a = std::exp(x) / (1 + std::exp(x));
        for (int i = 0; i < 4; i++) {
            std::transform(m_actuations_1[i].begin(), m_actuations_1[i].end(), m_actuations[i].begin(), op);
        }
        if (time >= m_time_pose) {
            m_phase = HOLD;
            std::cout << "time = " << time << "  Switch to phase: " << GetCurrentPhase() << std::endl;
            if (m_callback)
                m_callback->OnPhaseChange(POSE, m_phase);
        }
        return;
    }

    // In the HOLD phase, always use the first data entry
    if (m_phase == HOLD) {
        m_actuations = m_actuations_1;
        if (time >= m_offset) {
            m_phase = (m_ifs_start.is_open()) ? START : CYCLE;
            std::cout << "time = " << time << "  Switch to phase: " << GetCurrentPhase() << std::endl;
            if (m_callback)
                m_callback->OnPhaseChange(HOLD, m_phase);
        }
        return;
    }

    // Offset time
    double t = time - m_offset;

    switch (m_phase) {
        case START:
            while (t > m_time_2) {
                m_time_1 = m_time_2;
                m_actuations_1 = m_actuations_2;
                if (!m_ifs->eof()) {
                    LoadDataLine(m_time_2, m_actuations_2);
                } else {
                    m_phase = CYCLE;
                    m_ifs = &m_ifs_cycle;
                    LoadDataLine(m_time_1, m_actuations_1);
                    LoadDataLine(m_time_2, m_actuations_2);
                    m_offset = time;
                    std::cout << "time = " << time << "  Switch to phase: " << GetCurrentPhase() << std::endl;
                    if (m_callback)
                        m_callback->OnPhaseChange(START, CYCLE);
                    return;
                }
            }

            break;

        case CYCLE:
            if (!driven) {
                while (t > m_time_2) {
                    m_time_1 = m_time_2;
                    m_actuations_1 = m_actuations_2;
                    if (m_ifs->eof()) {
                        if (m_repeat) {
                            m_ifs->clear();
                            m_ifs->seekg(0);
                            LoadDataLine(m_time_1, m_actuations_1);
                            LoadDataLine(m_time_2, m_actuations_2);
                            m_offset = time;
                            std::cout << "time = " << time << " New cycle" << std::endl;
                            if (m_callback)
                                m_callback->OnPhaseChange(CYCLE, CYCLE);
                        }
                        return;
                    }
                    LoadDataLine(m_time_2, m_actuations_2);
                }
            } else {
                ext_actuation = true;
            }

            break;

        case STOP:
            //// TODO
            break;

        default:
            break;
    }

    // Interpolate  v = alpha_1 * v_1 + alpha_2 * v_2
    if (!ext_actuation) {
        axpby op;
        op.a1 = (t - m_time_2) / (m_time_1 - m_time_2);
        op.a2 = (t - m_time_1) / (m_time_2 - m_time_1);
        for (int i = 0; i < 4; i++) {
            std::transform(m_actuations_1[i].begin(), m_actuations_1[i].end(), m_actuations_2[i].begin(),
                           m_actuations[i].begin(), op);
        }
    }
}